

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrowHandler.cpp
# Opt level: O3

ArrowOpt __thiscall yb::ArrowHandler::handle(ArrowHandler *this,uchar c)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  long *plVar4;
  undefined7 in_register_00000031;
  long lVar5;
  size_type *local_50;
  type ec;
  
  lVar5 = CONCAT71(in_register_00000031,c);
  std::__cxx11::string::push_back(c + '@');
  plVar4 = *(long **)(lVar5 + 0x18);
  if (plVar4 != (long *)0x0) {
    do {
      lVar1 = plVar4[1];
      local_50 = &ec._M_string_length;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,plVar4[2],plVar4[3] + plVar4[2])
      ;
      iVar2 = std::__cxx11::string::compare((ulong)&local_50,0,*(string **)(lVar5 + 0x48));
      if (iVar2 == 0) {
        uVar3 = 4;
        if (ec._M_dataplus._M_p == *(pointer *)(lVar5 + 0x48)) {
          *(undefined8 *)(lVar5 + 0x48) = 0;
          **(undefined1 **)(lVar5 + 0x40) = 0;
          uVar3 = (int)lVar1;
        }
        *(undefined4 *)&this->escapeCodeGenerator_ = uVar3;
        *(undefined1 *)((long)&this->escapeCodeGenerator_ + 4) = 1;
        if (local_50 == &ec._M_string_length) {
          return (ArrowOpt)(_Optional_base<yb::Arrow,_false>)this;
        }
        operator_delete(local_50,ec._M_string_length + 1);
        return (ArrowOpt)(_Optional_base<yb::Arrow,_false>)this;
      }
      if (local_50 != &ec._M_string_length) {
        operator_delete(local_50,ec._M_string_length + 1);
      }
      plVar4 = (long *)*plVar4;
    } while (plVar4 != (long *)0x0);
  }
  *(undefined8 *)(lVar5 + 0x48) = 0;
  **(undefined1 **)(lVar5 + 0x40) = 0;
  this->escapeCodeGenerator_ = (EscapeCodeGenerator *)0x0;
  return (ArrowOpt)(_Optional_base<yb::Arrow,_false>)this;
}

Assistant:

ArrowHandler::ArrowOpt ArrowHandler::handle(unsigned char c) {
    currentState_ += c;
    for (auto it = escapeCodes_.begin(); it != escapeCodes_.end(); ++it) {
        auto arrow = std::get<0>(*it);
        auto ec = std::get<1>(*it);
        if (ec.compare(0, currentState_.length(), currentState_) == 0) {
            if (ec.length() == currentState_.length()) {
                currentState_.clear();
                return arrow;
            }
            return Arrow::invalid;
        }
    }
    currentState_.clear();
    return {};
}